

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

FrameDisplay *
Js::JavascriptOperators::OP_LdFrameDisplay(void *argHead,void *argEnv,ScriptContext *scriptContext)

{
  uint16 lhs;
  ThreadContext *threadContext;
  Recycler *pRVar1;
  FrameDisplay *pFVar2;
  void *item;
  ushort local_a2;
  uint16 j;
  TrackAllocData local_90;
  ushort local_52;
  FrameDisplay *pFStack_50;
  uint16 length;
  FrameDisplay *envDisplay;
  FrameDisplay *pDisplay;
  JsReentLock reentrancylock;
  ScriptContext *scriptContext_local;
  void *argEnv_local;
  void *argHead_local;
  
  reentrancylock._24_8_ = scriptContext;
  threadContext = ScriptContext::GetThreadContext(scriptContext);
  JsReentLock::JsReentLock((JsReentLock *)&pDisplay,threadContext);
  envDisplay = (FrameDisplay *)0x0;
  pFStack_50 = (FrameDisplay *)argEnv;
  lhs = FrameDisplay::GetLength((FrameDisplay *)argEnv);
  local_52 = UInt16Math::Add(lhs,1);
  pRVar1 = ScriptContext::GetRecycler((ScriptContext *)reentrancylock._24_8_);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_90,(type_info *)&FrameDisplay::typeinfo,(ulong)local_52 << 3,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
             ,0x1bb4);
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_90);
  pFVar2 = (FrameDisplay *)new<Memory::Recycler>(8,pRVar1,0x446fd0,0);
  FrameDisplay::FrameDisplay(pFVar2,local_52,false);
  envDisplay = pFVar2;
  for (local_a2 = 0; pFVar2 = envDisplay, (int)(uint)local_a2 < (int)(local_52 - 1);
      local_a2 = local_a2 + 1) {
    item = FrameDisplay::GetItem(pFStack_50,(uint)local_a2);
    FrameDisplay::SetItem(pFVar2,local_a2 + 1,item);
  }
  FrameDisplay::SetItem(envDisplay,0,argHead);
  pFVar2 = envDisplay;
  JsReentLock::~JsReentLock((JsReentLock *)&pDisplay);
  return pFVar2;
}

Assistant:

FrameDisplay* JavascriptOperators::OP_LdFrameDisplay(void *argHead, void *argEnv, ScriptContext* scriptContext)
    {
        JIT_HELPER_NOT_REENTRANT_HEADER(ScrObj_LdFrameDisplay, reentrancylock, scriptContext->GetThreadContext());
        // Build a display of nested frame objects.
        // argHead is the current scope; argEnv is either the lone trailing scope or an array of scopes
        // which we append to the new display.

        // Note that there are cases in which a function with no local frame must construct a display to pass
        // to the function(s) nested within it. In such a case, argHead will be a null object, and it's not
        // strictly necessary to include it. But such cases are rare and not perf critical, so it's not
        // worth the extra complexity to notify the nested functions that they can "skip" this slot in the
        // frame display when they're loading scopes nested outside it.

        FrameDisplay *pDisplay = nullptr;
        FrameDisplay *envDisplay = (FrameDisplay*)argEnv;
        uint16 length = UInt16Math::Add(envDisplay->GetLength(), 1);

        pDisplay = RecyclerNewPlus(scriptContext->GetRecycler(), length * sizeof(void*), FrameDisplay, length);
        for (uint16 j = 0; j < length - 1; j++)
        {
            pDisplay->SetItem(j + 1, envDisplay->GetItem(j));
        }

        pDisplay->SetItem(0, argHead);

        return pDisplay;
        JIT_HELPER_END(ScrObj_LdFrameDisplay);
    }